

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleUVRowDown2Box_C(uint8_t *src_uv,ptrdiff_t src_stride,uint8_t *dst_uv,int dst_width)

{
  long lVar1;
  
  if (0 < dst_width) {
    lVar1 = 0;
    do {
      dst_uv[lVar1 * 2] =
           (uint8_t)((uint)src_uv[lVar1 * 4 + src_stride] +
                     (uint)src_uv[lVar1 * 4 + 2] + (uint)src_uv[lVar1 * 4] +
                     (uint)src_uv[lVar1 * 4 + src_stride + 2] + 2 >> 2);
      dst_uv[lVar1 * 2 + 1] =
           (uint8_t)((uint)src_uv[lVar1 * 4 + src_stride + 1] +
                     (uint)src_uv[lVar1 * 4 + 3] + (uint)src_uv[lVar1 * 4 + 1] +
                     (uint)src_uv[lVar1 * 4 + src_stride + 3] + 2 >> 2);
      lVar1 = lVar1 + 1;
    } while (dst_width != (int)lVar1);
  }
  return;
}

Assistant:

void ScaleUVRowDown2Box_C(const uint8_t* src_uv,
                          ptrdiff_t src_stride,
                          uint8_t* dst_uv,
                          int dst_width) {
  int x;
  for (x = 0; x < dst_width; ++x) {
    dst_uv[0] = (src_uv[0] + src_uv[2] + src_uv[src_stride] +
                 src_uv[src_stride + 2] + 2) >>
                2;
    dst_uv[1] = (src_uv[1] + src_uv[3] + src_uv[src_stride + 1] +
                 src_uv[src_stride + 3] + 2) >>
                2;
    src_uv += 4;
    dst_uv += 2;
  }
}